

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bufferedReader.cpp
# Opt level: O3

ReaderData * __thiscall BufferedReader::getReader(BufferedReader *this,int readerID)

{
  int iVar1;
  _Base_ptr p_Var2;
  _Base_ptr p_Var3;
  _Rb_tree_header *p_Var4;
  ReaderData *pRVar5;
  
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)&this->m_readersMtx);
  if (iVar1 != 0) {
    std::__throw_system_error(iVar1);
  }
  p_Var3 = (this->m_readers)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  if (p_Var3 != (_Base_ptr)0x0) {
    p_Var4 = &(this->m_readers)._M_t._M_impl.super__Rb_tree_header;
    p_Var2 = &p_Var4->_M_header;
    do {
      if (readerID <= (int)p_Var3[1]._M_color) {
        p_Var2 = p_Var3;
      }
      p_Var3 = (&p_Var3->_M_left)[(int)p_Var3[1]._M_color < readerID];
    } while (p_Var3 != (_Base_ptr)0x0);
    if (((_Rb_tree_header *)p_Var2 != p_Var4) && ((int)p_Var2[1]._M_color <= readerID)) {
      pRVar5 = (ReaderData *)p_Var2[1]._M_parent;
      goto LAB_0017ec57;
    }
  }
  pRVar5 = (ReaderData *)0x0;
LAB_0017ec57:
  pthread_mutex_unlock((pthread_mutex_t *)&this->m_readersMtx);
  return pRVar5;
}

Assistant:

ReaderData* BufferedReader::getReader(const int readerID)
{
    std::lock_guard lock(m_readersMtx);
    const auto itr = m_readers.find(readerID);
    return itr != m_readers.end() ? itr->second : nullptr;
}